

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Iterator __thiscall
Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_>::insert
          (Map<Callback::Emitter_*,_List<Callback::Listener::Signal>_> *this,Item **cell,
          Item *parent,Emitter **key,List<Callback::Listener::Signal> *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  int iVar4;
  ItemBlock *pIVar5;
  Item *pIVar6;
  ulong uVar7;
  Iterator *pIVar8;
  long lVar9;
  Item *pIVar10;
  
  while( true ) {
    if ((cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) &&
       (iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar4 != 0)) goto LAB_00105418;
    pIVar10 = *cell;
    if (pIVar10 == (Item *)0x0) break;
    lVar9 = 0x70;
    if ((*key <= pIVar10->key) && (lVar9 = 0x68, pIVar10->key <= *key)) {
      List<Callback::Listener::Signal>::operator=(&pIVar10->value,value);
      return (Iterator)pIVar10;
    }
    cell = (Item **)((long)&pIVar10->key + lVar9);
    parent = pIVar10;
  }
  pIVar10 = this->freeItem;
  if (pIVar10 == (Item *)0x0) {
    pIVar5 = (ItemBlock *)operator_new__(0x268);
    pIVar5->next = this->blocks;
    this->blocks = pIVar5;
    pIVar10 = (Item *)0x0;
    for (uVar7 = 8; uVar7 < 0x268; uVar7 = uVar7 + 0x98) {
      pIVar5[0x13].next = (ItemBlock *)pIVar10;
      pIVar10 = (Item *)(pIVar5 + 1);
      pIVar5 = pIVar5 + 0x13;
    }
    this->freeItem = pIVar10;
  }
  Item::Item(pIVar10,parent,key,value);
  this->freeItem = pIVar10->prev;
  *cell = pIVar10;
  this->_size = this->_size + 1;
  if (parent == (Item *)0x0) {
    pIVar6 = (this->_begin).item;
    if (pIVar6 != &this->endItem) {
      iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                            ,0x1a1,"_begin.item == &endItem");
      if (iVar4 != 0) {
LAB_00105418:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      pIVar6 = (this->_begin).item;
    }
    pIVar10->prev = (Item *)0x0;
    pIVar10->next = pIVar6;
    (this->_begin).item = pIVar10;
    (this->endItem).prev = pIVar10;
  }
  else {
    pIVar6 = parent;
    if (cell == &parent->right) {
      pIVar6 = parent->next;
    }
    pIVar1 = pIVar6->prev;
    pIVar8 = (Iterator *)&pIVar1->next;
    if (pIVar1 == (Item *)0x0) {
      pIVar8 = &this->_begin;
    }
    pIVar10->prev = pIVar1;
    pIVar8->item = pIVar10;
    pIVar10->next = pIVar6;
    pIVar6->prev = pIVar10;
    while( true ) {
      uVar2 = parent->height;
      Item::updateHeightAndSlope(parent);
      pIVar6 = rebal(this,parent);
      if (uVar2 == pIVar6->height) break;
      parent = pIVar6->parent;
      if (parent == (Item *)0x0) {
        return (Iterator)pIVar10;
      }
    }
  }
  return (Iterator)pIVar10;
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }